

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGenerators::MakeParentDirectory(cmQtAutoGenerators *this,char *logPrefix,string *filename)

{
  bool bVar1;
  bool bVar2;
  string error;
  string dirName;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  cmsys::SystemTools::GetFilenamePath((string *)&local_40,filename);
  bVar2 = true;
  if (local_40._8_8_ != 0) {
    bVar1 = cmsys::SystemTools::MakeDirectory((string *)&local_40);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_60._M_local_buf,logPrefix,(allocator *)local_80);
      std::__cxx11::string::append(local_60._M_local_buf);
      cmQtAutoGeneratorCommon::Quoted((string *)local_80,filename);
      std::__cxx11::string::_M_append(local_60._M_local_buf,local_80._0_8_);
      if ((cmQtAutoGenerators *)local_80._0_8_ != (cmQtAutoGenerators *)(local_80 + 0x10)) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
      LogError((cmQtAutoGenerators *)local_80._0_8_,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_allocated_capacity != &local_50) {
        operator_delete((void *)local_60._M_allocated_capacity,local_50._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_allocated_capacity != &local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenerators::MakeParentDirectory(const char* logPrefix,
                                             const std::string& filename) const
{
  bool success = true;
  const std::string dirName = cmSystemTools::GetFilenamePath(filename);
  if (!dirName.empty()) {
    success = cmsys::SystemTools::MakeDirectory(dirName);
    if (!success) {
      std::string error = logPrefix;
      error += ": Error: Parent directory creation failed for ";
      error += Quoted(filename);
      this->LogError(error);
    }
  }
  return success;
}